

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void PrintVarDeclarator(FLispString *out,ZCC_TreeNode *node)

{
  ZCC_VarDeclarator *dnode;
  ZCC_TreeNode *node_local;
  FLispString *out_local;
  
  FLispString::Break(out);
  FLispString::Open(out,"var-declarator");
  FLispString::AddHex(out,*(uint *)&node[1].SiblingPrev);
  PrintNodes(out,node[1].SiblingNext,true,false);
  PrintNodes(out,(ZCC_TreeNode *)node[1].SourceName,true,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintVarDeclarator(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_VarDeclarator *dnode = (ZCC_VarDeclarator *)node;
	out.Break();
	out.Open("var-declarator");
	out.AddHex(dnode->Flags);
	PrintNodes(out, dnode->Type);
	PrintNodes(out, dnode->Names);
	out.Close();
}